

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O3

SoundDecoder * __thiscall SoundRenderer::CreateDecoder(SoundRenderer *this,FileReader *reader)

{
  (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
  return (SoundDecoder *)0x0;
}

Assistant:

SoundDecoder *SoundRenderer::CreateDecoder(FileReader *reader)
{
    SoundDecoder *decoder = NULL;
    int pos = reader->Tell();

#ifdef HAVE_MPG123
		decoder = new MPG123Decoder;
		if (decoder->open(reader))
			return decoder;
		reader->Seek(pos, SEEK_SET);

		delete decoder;
		decoder = NULL;
#endif
#ifdef HAVE_SNDFILE
		decoder = new SndFileDecoder;
		if (decoder->open(reader))
			return decoder;
		reader->Seek(pos, SEEK_SET);

		delete decoder;
		decoder = NULL;
#endif
    return decoder;
}